

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O0

void Abc_NtkRetimeBackwardInitialFinish
               (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew,Vec_Int_t *vValuesOld,int fVerbose)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vValues;
  int local_3c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vValuesNew;
  int fVerbose_local;
  Vec_Int_t *vValuesOld_local;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtk_local;
  
  for (local_3c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_3c);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsLatch(pAVar2), iVar1 != 0)) {
      pAVar2 = (pAVar2->field_6).pCopy;
      pFanin = Abc_NtkCreatePi(pNtkNew);
      Abc_ObjAddFanin(pAVar2,pFanin);
    }
  }
  Abc_NtkAddDummyPiNames(pNtkNew);
  Abc_NtkAddDummyPoNames(pNtkNew);
  iVar1 = Abc_NtkCheck(pNtkNew);
  if (iVar1 == 0) {
    fprintf(_stdout,"Abc_NtkRetimeBackwardInitialFinish(): Network check has failed.\n");
  }
  vValues = Abc_NtkRetimeInitialValues(pNtkNew,vValuesOld,fVerbose);
  Abc_NtkRetimeInsertLatchValues(pNtk,vValues);
  if (vValues != (Vec_Int_t *)0x0) {
    Vec_IntFree(vValues);
  }
  return;
}

Assistant:

void Abc_NtkRetimeBackwardInitialFinish( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew, Vec_Int_t * vValuesOld, int fVerbose )
{
    Vec_Int_t * vValuesNew;
    Abc_Obj_t * pObj;
    int i;
    // create PIs corresponding to the initial values
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            Abc_ObjAddFanin( pObj->pCopy, Abc_NtkCreatePi(pNtkNew) );
    // assign dummy node names
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    // check the network
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkRetimeBackwardInitialFinish(): Network check has failed.\n" );
    // derive new initial values
    vValuesNew = Abc_NtkRetimeInitialValues( pNtkNew, vValuesOld, fVerbose );
    // insert new initial values
    Abc_NtkRetimeInsertLatchValues( pNtk, vValuesNew );
    if ( vValuesNew ) Vec_IntFree( vValuesNew );
}